

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BinsSelectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinsSelectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::BinsSelectExpressionSyntax&,slang::syntax::CoverageIffClauseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,BinsSelectExpressionSyntax *args_4,
          CoverageIffClauseSyntax **args_5,Token *args_6)

{
  Info *pIVar1;
  Info *pIVar2;
  CoverageIffClauseSyntax *pCVar3;
  size_type sVar4;
  pointer ppAVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  BinsSelectionSyntax *pBVar26;
  long lVar27;
  
  pBVar26 = (BinsSelectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinsSelectionSyntax *)this->endPtr < pBVar26 + 1) {
    pBVar26 = (BinsSelectionSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pBVar26 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar6 = args_3->info;
  pCVar3 = *args_5;
  TVar22 = args_6->kind;
  uVar23 = args_6->field_0x2;
  NVar24.raw = (args_6->numFlags).raw;
  uVar25 = args_6->rawLen;
  pIVar7 = args_6->info;
  (pBVar26->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar26->super_MemberSyntax).super_SyntaxNode.kind = BinsSelection;
  SVar8 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pBVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pBVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)
   &(pBVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9
  ;
  (pBVar26->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pBVar26->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar4 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pBVar26->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pBVar26->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar4;
  (pBVar26->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (pBVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pBVar26;
  sVar4 = (pBVar26->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar4 != 0) {
    ppAVar5 = (pBVar26->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar27 = 0;
    do {
      **(undefined8 **)((long)ppAVar5 + lVar27) = pBVar26;
      lVar27 = lVar27 + 8;
    } while (sVar4 << 3 != lVar27);
  }
  (pBVar26->keyword).kind = TVar10;
  (pBVar26->keyword).field_0x2 = uVar11;
  (pBVar26->keyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (pBVar26->keyword).rawLen = uVar13;
  (pBVar26->keyword).info = pIVar1;
  (pBVar26->name).kind = TVar14;
  (pBVar26->name).field_0x2 = uVar15;
  (pBVar26->name).numFlags = (NumericTokenFlags)NVar16.raw;
  (pBVar26->name).rawLen = uVar17;
  (pBVar26->name).info = pIVar2;
  (pBVar26->equals).kind = TVar18;
  (pBVar26->equals).field_0x2 = uVar19;
  (pBVar26->equals).numFlags = (NumericTokenFlags)NVar20.raw;
  (pBVar26->equals).rawLen = uVar21;
  (pBVar26->equals).info = pIVar6;
  (pBVar26->expr).ptr = args_4;
  pBVar26->iff = pCVar3;
  (pBVar26->semi).kind = TVar22;
  (pBVar26->semi).field_0x2 = uVar23;
  (pBVar26->semi).numFlags = (NumericTokenFlags)NVar24.raw;
  (pBVar26->semi).rawLen = uVar25;
  (pBVar26->semi).info = pIVar7;
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)pBVar26;
  if (pCVar3 != (CoverageIffClauseSyntax *)0x0) {
    (pCVar3->super_SyntaxNode).parent = (SyntaxNode *)pBVar26;
  }
  return pBVar26;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }